

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_leb.c
# Opt level: O2

int dwarf_encode_signed_leb128(Dwarf_Signed value,int *nbytes,char *space,int splen)

{
  int iVar1;
  Dwarf_Signed DVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)(space + splen);
  iVar1 = 1;
  DVar2 = value;
  while( true ) {
    if (pbVar3 <= space) {
      return 1;
    }
    if ((DVar2 >> 7 == value >> 0x3f) && ((((uint)DVar2 ^ (uint)(value >> 0x3f)) & 0x40) == 0))
    break;
    *space = (byte)DVar2 | 0x80;
    space = (char *)((byte *)space + 1);
    iVar1 = iVar1 + 1;
    DVar2 = DVar2 >> 7;
  }
  *space = (byte)DVar2 & 0x7f;
  *nbytes = iVar1;
  return 0;
}

Assistant:

int dwarf_encode_signed_leb128(Dwarf_Signed value, int *nbytes,
    char *space, int splen)
{
    char *str;
    Dwarf_Signed sign = -(value < 0);
    int more = 1;
    char *end = space + splen;

    str = space;

    do {
        unsigned char byte = value & DATA_MASK;

        value >>= DIGIT_WIDTH;

        if (str >= end) {
            return DW_DLV_ERROR;
        }
        /*  Remaining chunks would just contain the sign
            bit, and this chunk
            has already captured at least one sign bit.  */
        if (value == sign &&
            ((byte & SIGN_BIT) == (sign & SIGN_BIT))) {
            more = 0;
        } else {
            byte |= MORE_BYTES;
        }
        *str = byte;
        str++;
    } while (more);
    *nbytes = (int)(str - space);
    return DW_DLV_OK;
}